

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

size_t apduRespDec(apdu_resp_t *resp,octet *apdu,size_t count)

{
  void *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  octet in_stack_ffffffffffffffdf;
  size_t local_8;
  
  if (in_RDX < (void *)0x2) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RDI != (undefined1 *)0x0) {
      memSet(in_RDX,in_stack_ffffffffffffffdf,0x121c82);
      *in_RDI = *(undefined1 *)((long)in_RDX + in_RSI + -2);
      in_RDI[1] = *(undefined1 *)((long)in_RDX + in_RSI + -1);
      *(long *)(in_RDI + 8) = (long)in_RDX + -2;
      memCopy(in_RDX,(void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0x121ce1)
      ;
    }
    local_8 = (long)in_RDX + 0xe;
  }
  return local_8;
}

Assistant:

size_t apduRespDec(apdu_resp_t* resp, const octet apdu[], size_t count)
{
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(resp, sizeof(apdu_resp_t)));
	// декодировать
	if (count < 2)
		return SIZE_MAX;
	if (resp)
	{
		memSetZero(resp, sizeof(apdu_resp_t));
		resp->sw1 = apdu[count - 2], resp->sw2 = apdu[count - 1];
		resp->rdf_len = count - 2;
		memCopy(resp->rdf, apdu, resp->rdf_len);
	}
	// возвратить размер resp
	return sizeof(apdu_resp_t) + count - 2;
}